

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::PipelineHook,_std::nullptr_t> __thiscall
capnp::QueuedPipeline::addRef(QueuedPipeline *this)

{
  PipelineHook *extraout_RDX;
  QueuedPipeline *in_RSI;
  Own<capnp::PipelineHook,_std::nullptr_t> OVar1;
  Own<capnp::QueuedPipeline,_std::nullptr_t> local_28;
  QueuedPipeline *this_local;
  
  this_local = this;
  kj::addRef<capnp::QueuedPipeline>((kj *)&local_28,in_RSI);
  kj::Own<capnp::PipelineHook,decltype(nullptr)>::Own<capnp::QueuedPipeline,void>
            ((Own<capnp::PipelineHook,decltype(nullptr)> *)this,&local_28);
  kj::Own<capnp::QueuedPipeline,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<PipelineHook> addRef() override {
    return kj::addRef(*this);
  }